

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_underflow.c
# Opt level: O1

int main(void)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  char src [12];
  char local_10 [16];
  
  builtin_strncpy(local_10,"Hello World",0xc);
  sVar1 = strlen(local_10);
  iVar2 = (int)sVar1 + -1;
  if (local_10[iVar2] != ':') {
    pcVar3 = local_10 + iVar2;
    iVar2 = (int)sVar1 + -2;
    do {
      *pcVar3 = '\0';
      pcVar3 = local_10 + iVar2;
      iVar2 = iVar2 + -1;
    } while (*pcVar3 != ':');
  }
  return 0;
}

Assistant:

int main() {
  char src[12];
  strncpy(src, "Hello World", sizeof(src));

  size_t length = strlen(src);

  int index = (length -1);
  while (src[index] != ':') {
    src[index] = '\0';
    index--;
  }
}